

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page-queue.c
# Opt level: O2

size_t mi_good_size(size_t size)

{
  size_t sVar1;
  ulong uVar2;
  
  if (size < 0x10001) {
    sVar1 = mi_bin(size);
    sVar1 = _mi_heap_empty.pages[sVar1].block_size;
  }
  else {
    sVar1 = _mi_os_page_size();
    uVar2 = (sVar1 + size) - 1;
    if ((sVar1 & sVar1 - 1) == 0) {
      sVar1 = uVar2 & -sVar1;
    }
    else {
      sVar1 = uVar2 - uVar2 % sVar1;
    }
  }
  return sVar1;
}

Assistant:

size_t mi_good_size(size_t size) mi_attr_noexcept {
  if (size <= MI_MEDIUM_OBJ_SIZE_MAX) {
    return _mi_bin_size(mi_bin(size + MI_PADDING_SIZE));
  }
  else {
    return _mi_align_up(size + MI_PADDING_SIZE,_mi_os_page_size());
  }
}